

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_alist.c
# Opt level: O0

mod2sparse * load_alist(char *alist_file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  mod2entry *pmVar6;
  undefined8 in_RDI;
  int N;
  int M;
  int nxt;
  int trans;
  int tot;
  int k;
  int j;
  int i;
  int *cw;
  int *rw;
  int mxcw;
  int mxrw;
  mod2sparse *H;
  FILE *af;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int col;
  int in_stack_ffffffffffffffc4;
  int iVar7;
  int local_20;
  int local_1c;
  mod2sparse *local_18;
  FILE *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = (FILE *)open_file_std((char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),
                                   (char *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0));
  if (local_10 == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t open alist file: %s\n",local_8);
    exit(1);
  }
  iVar1 = __isoc99_fscanf(local_10,"%d",&stack0xffffffffffffffb4);
  if ((((iVar1 != 1) || ((int)in_stack_ffffffffffffffb4 < 1)) ||
      (iVar1 = __isoc99_fscanf(local_10,"%d",&stack0xffffffffffffffb0), iVar1 != 1)) ||
     ((((((int)in_stack_ffffffffffffffb0 < 1 ||
         (iVar1 = __isoc99_fscanf(local_10,"%d",&local_1c), iVar1 != 1)) ||
        ((local_1c < 0 ||
         (((int)in_stack_ffffffffffffffb0 < local_1c ||
          (iVar1 = __isoc99_fscanf(local_10,"%d",&local_20), iVar1 != 1)))))) || (local_20 < 0)) ||
      ((int)in_stack_ffffffffffffffb4 < local_20)))) {
    bad_alist_file();
  }
  pvVar4 = chk_alloc(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  for (iVar1 = 0; iVar1 < (int)in_stack_ffffffffffffffb4; iVar1 = iVar1 + 1) {
    iVar2 = __isoc99_fscanf(local_10,"%d",(void *)((long)pvVar4 + (long)iVar1 * 4));
    if (((iVar2 != 1) || (*(int *)((long)pvVar4 + (long)iVar1 * 4) < 0)) ||
       ((int)in_stack_ffffffffffffffb0 < *(int *)((long)pvVar4 + (long)iVar1 * 4))) {
      bad_alist_file();
    }
  }
  pvVar5 = chk_alloc(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  for (iVar1 = 0; iVar1 < (int)in_stack_ffffffffffffffb0; iVar1 = iVar1 + 1) {
    iVar2 = __isoc99_fscanf(local_10,"%d",(void *)((long)pvVar5 + (long)iVar1 * 4));
    if (((iVar2 != 1) || (*(int *)((long)pvVar5 + (long)iVar1 * 4) < 0)) ||
       ((int)in_stack_ffffffffffffffb4 < *(int *)((long)pvVar5 + (long)iVar1 * 4))) {
      bad_alist_file();
    }
  }
  local_18 = mod2sparse_allocate(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  do {
    iVar2 = __isoc99_fscanf(local_10,"%d",&stack0xffffffffffffffb8);
    if (iVar2 != 1) {
      in_stack_ffffffffffffffb8 = -1;
    }
  } while (in_stack_ffffffffffffffb8 == 0);
  col = 0;
  for (iVar2 = 0; iVar2 < (int)in_stack_ffffffffffffffb4; iVar2 = iVar2 + 1) {
    for (iVar7 = 0; iVar7 < *(int *)((long)pvVar4 + (long)iVar2 * 4); iVar7 = iVar7 + 1) {
      if (((in_stack_ffffffffffffffb8 < 1) ||
          ((int)in_stack_ffffffffffffffb0 < in_stack_ffffffffffffffb8)) ||
         (pmVar6 = mod2sparse_find((mod2sparse *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                   in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
         pmVar6 != (mod2entry *)0x0)) {
        bad_alist_file();
      }
      mod2sparse_insert((mod2sparse *)CONCAT44(iVar2,iVar1),iVar7,col);
      col = col + 1;
      do {
        iVar3 = __isoc99_fscanf(local_10,"%d",&stack0xffffffffffffffb8);
        if (iVar3 != 1) {
          in_stack_ffffffffffffffb8 = -1;
        }
      } while (in_stack_ffffffffffffffb8 == 0);
    }
  }
  for (iVar1 = 0; iVar1 < (int)in_stack_ffffffffffffffb0; iVar1 = iVar1 + 1) {
    for (iVar2 = 0; iVar2 < *(int *)((long)pvVar5 + (long)iVar1 * 4); iVar2 = iVar2 + 1) {
      if (((in_stack_ffffffffffffffb8 < 1) ||
          ((int)in_stack_ffffffffffffffb4 < in_stack_ffffffffffffffb8)) ||
         (pmVar6 = mod2sparse_find((mod2sparse *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                   in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
         pmVar6 == (mod2entry *)0x0)) {
        bad_alist_file();
      }
      col = col + -1;
      do {
        iVar7 = __isoc99_fscanf(local_10,"%d",&stack0xffffffffffffffb8);
        if (iVar7 != 1) {
          in_stack_ffffffffffffffb8 = -1;
        }
      } while (in_stack_ffffffffffffffb8 == 0);
    }
  }
  if (((col == 0) && (in_stack_ffffffffffffffb8 == -1)) && (iVar1 = feof(local_10), iVar1 != 0)) {
    return local_18;
  }
  bad_alist_file();
  return local_18;
}

Assistant:

mod2sparse *load_alist
(char *alist_file)
{
  FILE *af;

  mod2sparse *H;

  int mxrw, mxcw;
  int *rw, *cw;
  int i, j, k;
  int tot, trans;
  int nxt;
  int M,N;

  af = open_file_std(alist_file,"r");

  if (af==NULL) 
  { fprintf(stderr,"Can't open alist file: %s\n",alist_file);
    exit(1);
  }

  if (fscanf(af,"%d",&M)!=1 || M<1
   || fscanf(af,"%d",&N)!=1 || N<1
   || fscanf(af,"%d",&mxrw)!=1 || mxrw<0 || mxrw>N 
   || fscanf(af,"%d",&mxcw)!=1 || mxcw<0 || mxcw>M)
  { bad_alist_file();
  }

  rw = (int *) chk_alloc (M, sizeof *rw);

  for (i = 0; i<M; i++)
  { if (fscanf(af,"%d",&rw[i])!=1 || rw[i]<0 || rw[i]>N)
    { bad_alist_file();
    }
  }

  cw = (int *) chk_alloc (N, sizeof *cw);

  for (j = 0; j<N; j++)
  { if (fscanf(af,"%d",&cw[j])!=1 || cw[j]<0 || cw[j]>M)
    { bad_alist_file();
    }
  }

   H = mod2sparse_allocate(M,N);

  do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
      
  tot = 0;

  for (i = 0; i<M; i++)
  { for (k = 0; k<rw[i]; k++)
    { if (nxt<=0 || nxt>N || mod2sparse_find(H,i,nxt-1))
      { bad_alist_file();
      }
      mod2sparse_insert(H,i,nxt-1);
      tot += 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  for (j = 0; j<N; j++)
  { for (k = 0; k<cw[j]; k++)
    { if (nxt<=0 || nxt>M || !mod2sparse_find(H,nxt-1,j))
      { bad_alist_file();
      }
      tot -= 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  if (tot!=0 || nxt!=-1 || !feof(af))
  { bad_alist_file();
  }

  return H;
}